

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinsizes.cpp
# Opt level: O0

void change_pos_dim(Am_Drawonable *d)

{
  undefined4 local_20;
  undefined4 local_1c;
  uint height;
  uint width;
  uint top;
  uint left;
  Am_Drawonable *d_local;
  
  width = 999;
  _top = d;
  printf("Changing POSITION/SIZE of blue window.  Enter four values\n");
  printf("  separated by spaces (or CTRL-D RETURN to exit): ");
  __isoc99_scanf("%d %d %d %d",&width,&height,&local_1c,&local_20);
  getchar();
  if (width == 999) {
    printf("\n");
  }
  else {
    (**(code **)(*(long *)_top + 0x50))(_top,width,height);
    (**(code **)(*(long *)_top + 0x58))(_top,local_1c,local_20);
    print_win_info(_top,"blue window");
    change_pos_dim(_top);
  }
  return;
}

Assistant:

void
change_pos_dim(Am_Drawonable *d)
{

  unsigned int left, top, width, height;
  left = 999;

  printf("Changing POSITION/SIZE of blue window.  Enter four values\n");
  printf("  separated by spaces (or CTRL-D RETURN to exit): ");

  scanf("%d %d %d %d", &left, &top, &width, &height);
  getchar(); // Eat carriage return

  if (left == 999) {
    printf("\n");
    return;
  } else {
    d->Set_Position(left, top);
    d->Set_Size(width, height); // Does Flush_Output()
    print_win_info(d, "blue window");
    change_pos_dim(d);
  }
}